

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_photogrammetry.cpp
# Opt level: O0

bool __thiscall
ON_AerialPhotoCameraPosition::SetOrientationVectors
          (ON_AerialPhotoCameraPosition *this,ON_3dVector camera_up,ON_3dVector camera_right,
          ON_3dVector camera_direction)

{
  ON_Xform camera_rotation;
  bool bVar1;
  double dVar2;
  bool local_21a;
  bool local_219;
  bool local_1f1;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  double dStack_178;
  undefined1 local_170 [8];
  ON_Xform R;
  double d;
  double max_dot;
  undefined1 auStack_c0 [7];
  bool rc;
  ON_3dVector local_a8;
  ON_3dVector local_90;
  ON_3dVector local_78;
  bool local_5b;
  bool local_5a;
  bool local_59;
  undefined1 auStack_58 [5];
  bool bHaveZ;
  bool bHaveY;
  bool bHaveX;
  ON_3dVector Z;
  ON_3dVector Y;
  ON_3dVector X;
  ON_AerialPhotoCameraPosition *this_local;
  
  Y.z = camera_right.x;
  X.x = camera_right.y;
  X.y = camera_right.z;
  Z.z = camera_up.x;
  Y.x = camera_up.y;
  Y.y = camera_up.z;
  ON_3dVector::operator-((ON_3dVector *)auStack_58,&camera_direction);
  bVar1 = ON_3dVector::IsValid((ON_3dVector *)&Y.z);
  local_1f1 = false;
  if (bVar1) {
    local_1f1 = ON_3dVector::Unitize((ON_3dVector *)&Y.z);
  }
  local_59 = local_1f1;
  bVar1 = ON_3dVector::IsValid((ON_3dVector *)&Z.z);
  local_219 = false;
  if (bVar1) {
    local_219 = ON_3dVector::Unitize((ON_3dVector *)&Z.z);
  }
  local_5a = local_219;
  bVar1 = ON_3dVector::IsValid((ON_3dVector *)auStack_58);
  local_21a = false;
  if (bVar1) {
    local_21a = ON_3dVector::Unitize((ON_3dVector *)auStack_58);
  }
  local_5b = local_21a;
  if ((((local_59 & 1U) == 0) && ((local_5a & 1U) != 0)) && (local_21a != false)) {
    ON_CrossProduct(&local_78,(ON_3dVector *)&Z.z,(ON_3dVector *)auStack_58);
    Y.z = local_78.x;
    X.x = local_78.y;
    X.y = local_78.z;
    local_59 = ON_3dVector::Unitize((ON_3dVector *)&Y.z);
    if (local_59) {
      camera_right.x = Y.z;
      camera_right.y = local_78.y;
      camera_right.z = local_78.z;
    }
  }
  else if ((((local_5a & 1U) == 0) && (local_21a != false)) && ((local_59 & 1U) != 0)) {
    ON_CrossProduct(&local_90,(ON_3dVector *)auStack_58,(ON_3dVector *)&Y.z);
    Z.z = local_90.x;
    Y.x = local_90.y;
    Y.y = local_90.z;
    local_5a = ON_3dVector::Unitize((ON_3dVector *)&Z.z);
    if (local_5a) {
      camera_up.x = Z.z;
      camera_up.y = Y.x;
      camera_up.z = Y.y;
    }
  }
  else if (((local_21a == false) && ((local_59 & 1U) != 0)) && ((local_5a & 1U) != 0)) {
    ON_CrossProduct(&local_a8,(ON_3dVector *)&Y.z,(ON_3dVector *)&Z.z);
    _auStack_58 = local_a8.x;
    Z.x = local_a8.y;
    Z.y = local_a8.z;
    local_5b = ON_3dVector::Unitize((ON_3dVector *)auStack_58);
    if (local_5b) {
      ON_3dVector::operator-((ON_3dVector *)auStack_c0,(ON_3dVector *)auStack_58);
      camera_direction.x = _auStack_c0;
    }
  }
  max_dot._7_1_ = false;
  if ((((local_59 & 1U) != 0) && ((local_5a & 1U) != 0)) && ((local_5b & 1U) != 0)) {
    d = 0.0;
    dVar2 = ON_3dVector::operator*((ON_3dVector *)&Y.z,(ON_3dVector *)&Z.z);
    if (0.0 < ABS(dVar2)) {
      d = ABS(dVar2);
    }
    dVar2 = ON_3dVector::operator*((ON_3dVector *)&Z.z,(ON_3dVector *)auStack_58);
    if (d < ABS(dVar2)) {
      d = ABS(dVar2);
    }
    dVar2 = ON_3dVector::operator*((ON_3dVector *)auStack_58,(ON_3dVector *)&Y.z);
    if (d < ABS(dVar2)) {
      d = ABS(dVar2);
    }
    if (d <= 1e-08) {
      ON_CrossProduct((ON_3dVector *)(R.m_xform[3] + 3),(ON_3dVector *)&Y.z,(ON_3dVector *)&Z.z);
      dVar2 = ON_3dVector::operator*((ON_3dVector *)auStack_58,(ON_3dVector *)(R.m_xform[3] + 3));
      if (0.0 < dVar2) {
        ON_Xform::ON_Xform((ON_Xform *)local_170);
        local_170 = (undefined1  [8])Y.z;
        R.m_xform[0][0] = Z.z;
        R.m_xform[0][1] = _auStack_58;
        R.m_xform[0][2] = 0.0;
        R.m_xform[0][3] = X.x;
        R.m_xform[1][0] = Y.x;
        R.m_xform[1][1] = Z.x;
        R.m_xform[1][2] = 0.0;
        R.m_xform[1][3] = X.y;
        R.m_xform[2][0] = Y.y;
        R.m_xform[2][1] = Z.y;
        R.m_xform[2][2] = 0.0;
        R.m_xform[2][3] = 0.0;
        R.m_xform[3][0] = 0.0;
        R.m_xform[3][1] = 0.0;
        R.m_xform[3][2] = 1.0;
        memcpy(&local_1f0,local_170,0x80);
        camera_rotation.m_xform[0][1] = (double)uStack_1e8;
        camera_rotation.m_xform[0][0] = (double)local_1f0;
        camera_rotation.m_xform[0][2] = (double)local_1e0;
        camera_rotation.m_xform[0][3] = (double)uStack_1d8;
        camera_rotation.m_xform[1][0] = (double)local_1d0;
        camera_rotation.m_xform[1][1] = (double)uStack_1c8;
        camera_rotation.m_xform[1][2] = (double)local_1c0;
        camera_rotation.m_xform[1][3] = (double)uStack_1b8;
        camera_rotation.m_xform[2][0] = (double)local_1b0;
        camera_rotation.m_xform[2][1] = (double)uStack_1a8;
        camera_rotation.m_xform[2][2] = (double)local_1a0;
        camera_rotation.m_xform[2][3] = (double)uStack_198;
        camera_rotation.m_xform[3][0] = (double)local_190;
        camera_rotation.m_xform[3][1] = (double)uStack_188;
        camera_rotation.m_xform[3][2] = (double)local_180;
        camera_rotation.m_xform[3][3] = dStack_178;
        max_dot._7_1_ = SetOrientationRotation(this,camera_rotation);
        if (max_dot._7_1_) {
          (this->m_orientation_right).x = camera_right.x;
          (this->m_orientation_right).y = camera_right.y;
          (this->m_orientation_right).z = camera_right.z;
          (this->m_orientation_up).x = camera_up.x;
          (this->m_orientation_up).y = camera_up.y;
          (this->m_orientation_up).z = camera_up.z;
          (this->m_orientation_direction).x = camera_direction.x;
          (this->m_orientation_direction).y = camera_direction.y;
          (this->m_orientation_direction).z = camera_direction.z;
        }
      }
    }
  }
  if (max_dot._7_1_ == false) {
    UnsetOrientation(this);
  }
  return max_dot._7_1_;
}

Assistant:

bool ON_AerialPhotoCameraPosition::SetOrientationVectors(
    ON_3dVector camera_up,
    ON_3dVector camera_right,
    ON_3dVector camera_direction
    )
{
  ON_3dVector X(camera_right);
  ON_3dVector Y(camera_up);
  ON_3dVector Z(-camera_direction);

  bool bHaveX = ( X.IsValid() && X.Unitize() );
  bool bHaveY = ( Y.IsValid() && Y.Unitize() );
  bool bHaveZ = ( Z.IsValid() && Z.Unitize() );
  
  if ( !bHaveX && bHaveY && bHaveZ )
  {
    X = ON_CrossProduct(Y,Z);
    bHaveX = X.Unitize();
    if ( bHaveX )
      camera_right = X;
  }
  else if ( !bHaveY && bHaveZ && bHaveX )
  {
    Y = ON_CrossProduct(Z,X);
    bHaveY = Y.Unitize();
    if ( bHaveY )
      camera_up = Y;
  }
  else if ( !bHaveZ && bHaveX && bHaveY )
  {
    Z = ON_CrossProduct(X,Y);
    bHaveZ = Z.Unitize();
    if ( bHaveZ )
      camera_direction = -Z;
  }

  bool rc = false;
  for (;;)
  {
    if ( !bHaveX || !bHaveY || !bHaveZ )
      break;

    double max_dot = 0.0;
    double d = fabs(X*Y);
    if ( d > max_dot )
      max_dot = d;
    d = fabs(Y*Z);
    if ( d > max_dot )
      max_dot = d;
    d = fabs(Z*X);
    if ( d > max_dot )
      max_dot = d;

    if ( max_dot > 1.0e-8 )
      break;

    d = Z*ON_CrossProduct(X,Y);
    if ( !(d > 0.0) )
      break;

    ON_Xform R;
    R.m_xform[0][0] = X.x; R.m_xform[0][1] = Y.x; R.m_xform[0][2] = Z.x; R.m_xform[0][3] = 0.0;
    R.m_xform[1][0] = X.y; R.m_xform[1][1] = Y.y; R.m_xform[1][2] = Z.y; R.m_xform[1][3] = 0.0;
    R.m_xform[2][0] = X.z; R.m_xform[2][1] = Y.z; R.m_xform[2][2] = Z.z; R.m_xform[2][3] = 0.0;
    R.m_xform[3][0] = 0.0; R.m_xform[3][1] = 0.0; R.m_xform[3][2] = 0.0; R.m_xform[3][3] = 1.0;

    rc = SetOrientationRotation(R);

    if (rc)
    {
      // preserve exact values of input parameters
      m_orientation_right = camera_right;
      m_orientation_up = camera_up;
      m_orientation_direction = camera_direction;
    }

    break;
  }

  if (!rc)
  {
    UnsetOrientation();
  }

  return rc;
}